

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O3

void DBaseDecal::SerializeChain(FArchive *arc,DBaseDecal **first)

{
  DWORD DVar1;
  DBaseDecal *in_RAX;
  DBaseDecal *pDVar2;
  DBaseDecal *local_28;
  
  if (arc->m_Loading == true) {
    local_28 = in_RAX;
    for (DVar1 = FArchive::ReadCount(arc); DVar1 != 0; DVar1 = DVar1 - 1) {
      FArchive::SerializeObject(arc,(DObject **)&local_28,RegistrationInfo.MyClass);
      *first = local_28;
      local_28->WallPrev = first;
      first = &local_28->WallNext;
    }
  }
  else {
    DVar1 = 0;
    for (pDVar2 = *first; pDVar2 != (DBaseDecal *)0x0; pDVar2 = pDVar2->WallNext) {
      DVar1 = DVar1 + 1;
    }
    FArchive::WriteCount(arc,DVar1);
    local_28 = *first;
    for (; DVar1 != 0; DVar1 = DVar1 - 1) {
      FArchive::SerializeObject(arc,(DObject **)&local_28,RegistrationInfo.MyClass);
      local_28 = local_28->WallNext;
    }
  }
  return;
}

Assistant:

void DBaseDecal::SerializeChain (FArchive &arc, DBaseDecal **first)
{
	DWORD numInChain;
	DBaseDecal *fresh;
	DBaseDecal **firstptr = first;

	if (arc.IsLoading ())
	{
		numInChain = arc.ReadCount ();
		
		while (numInChain--)
		{
			arc << fresh;
			*firstptr = fresh;
			fresh->WallPrev = firstptr;
			firstptr = &fresh->WallNext;
		}
	}
	else
	{
		numInChain = 0;
		fresh = *firstptr;
		while (fresh != NULL)
		{
			fresh = fresh->WallNext;
			++numInChain;
		}
		arc.WriteCount (numInChain);
		fresh = *firstptr;
		while (numInChain--)
		{
			arc << fresh;
			fresh = fresh->WallNext;
		}
	}
}